

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbtz.cpp
# Opt level: O2

int32_t __thiscall
icu_63::RuleBasedTimeZone::getOffset
          (RuleBasedTimeZone *this,uint8_t era,int32_t year,int32_t month,int32_t day,
          uint8_t param_5,int32_t millis,int32_t param_7,UErrorCode *status)

{
  int32_t iVar1;
  int year_00;
  double dVar2;
  int32_t dstOffset;
  int32_t rawOffset;
  
  iVar1 = 0;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    year_00 = 1 - year;
    if (era != '\0') {
      year_00 = year;
    }
    dVar2 = Grego::fieldsToDay(year_00,month,day);
    getOffsetInternal(this,dVar2 * 86400000.0 + (double)millis,'\x01',3,1,&rawOffset,&dstOffset,
                      status);
    iVar1 = 0;
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      iVar1 = dstOffset + rawOffset;
    }
  }
  return iVar1;
}

Assistant:

int32_t
RuleBasedTimeZone::getOffset(uint8_t era, int32_t year, int32_t month, int32_t day,
                             uint8_t /*dayOfWeek*/, int32_t millis,
                             int32_t /*monthLength*/, UErrorCode& status) const {
    // dayOfWeek and monthLength are unused
    if (U_FAILURE(status)) {
        return 0;
    }
    if (era == GregorianCalendar::BC) {
        // Convert to extended year
        year = 1 - year;
    }
    int32_t rawOffset, dstOffset;
    UDate time = (UDate)Grego::fieldsToDay(year, month, day) * U_MILLIS_PER_DAY + millis;
    getOffsetInternal(time, TRUE, kDaylight, kStandard, rawOffset, dstOffset, status);
    if (U_FAILURE(status)) {
        return 0;
    }
    return (rawOffset + dstOffset);
}